

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tui.cc
# Opt level: O3

void curses_interface_exec(_func_void_void_ptr *idle_proc,void *idle_data)

{
  ulong uVar1;
  undefined4 uVar2;
  pointer pcVar3;
  WINDOW *w_00;
  _win_st *p_Var4;
  Player *pPVar5;
  WINDOW_u WVar6;
  size_type sVar7;
  _func_void_void_ptr *p_Var8;
  void *pvVar9;
  char cVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  Player_Type PVar14;
  uint uVar15;
  File_Selection_Code FVar16;
  char *pcVar17;
  _Head_base<0UL,_Player_*,_false> _Var18;
  undefined8 uVar19;
  IniProcessingVariant *pIVar20;
  Midi_Program_Ex *pMVar21;
  __uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true> _Var22;
  long *plVar23;
  size_type *psVar24;
  bool bVar25;
  Program *pPVar26;
  undefined1 *puVar27;
  char *in_R8;
  char *in_R9;
  Midi_Spec spec;
  ulong uVar28;
  short sVar29;
  long lVar30;
  string *psVar31;
  int in_stack_ffffffffffffed08;
  File_Selector fs;
  string bankname_field;
  WINDOW_u w;
  long local_12c0;
  IniProcessingVariant local_12b8;
  _func_void_void_ptr *local_1290;
  string __str;
  string local_1268;
  void *local_1248;
  pointer local_1240;
  TUI_context ctx;
  undefined1 *local_1098 [2];
  undefined1 local_1088 [16];
  undefined1 *local_1078 [2];
  undefined1 local_1068 [16];
  undefined1 *local_1058 [2];
  undefined1 local_1048 [16];
  char pathbuf [4097];
  
  initscr();
  ctx.quit = false;
  memset(&ctx.win,0,0xf8);
  ctx.status_text._M_dataplus._M_p = (pointer)&ctx.status_text.field_2;
  ctx.status_text._M_string_length = 0;
  ctx.status_text.field_2._M_local_buf[0] = '\0';
  ctx.status_display = false;
  ctx.bank_directory._M_dataplus._M_p = (pointer)&ctx.bank_directory.field_2;
  ctx.status_timeout = 0;
  ctx.status_start.__d.__r._0_4_ = 0;
  ctx.status_start.__d.__r._4_4_ = 0;
  ctx.player._0_4_ = 0;
  ctx.player._4_4_ = 0;
  ctx.bank_directory._M_string_length = 0;
  ctx.bank_directory.field_2._M_local_buf[0] = '\0';
  ctx.perc_display_program.spec = GM;
  ctx.bank_mtime[0] = 0;
  ctx.bank_mtime[1]._0_5_ = 0;
  ctx.bank_mtime[1]._5_3_ = 0;
  ctx.perc_display_cycle = 0;
  ctx.have_perc_display_program = false;
  ctx.perc_display_program.name = (char *)0x0;
  ctx.channel_state.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
  ctx.channel_state.size = 0;
  ctx.channel_state.serial = 0;
  local_1290 = idle_proc;
  local_1248 = idle_data;
  ctx.idle_proc = idle_proc;
  ctx.idle_data = idle_data;
  cVar10 = has_colors();
  if (cVar10 != '\0') {
    start_color();
    cVar10 = can_change_color();
    if (cVar10 != '\0') {
      init_color(0,0xb4,0xcb,0xd3);
      init_color(1,800,0,0);
      init_color(2,0x131,0x25b,0x17);
      init_color(3,0x300,0x273,0);
      init_color(4,0xcb,0x18c,0x283);
      init_color(5,0x1ca,0x139,0x1e2);
      init_color(6,0x17,0x254,0x25b);
      init_color(7,0x33b,0x34b,0x32b);
      init_color(8,0x14d,0x155,0x145);
      init_color(9,0x3a9,0xa0,0xa0);
      init_color(10,0x21d,0x376,0xcb);
      init_color(0xb,0x3c0,0x1da,0);
      init_color(0xc,0x1bf,0x26f,0x32b);
      init_color(0xd,0x2a6,0x1f2,0x292);
      init_color(0xe,0xcb,0x376,0x376);
      init_color(0xf,0x3a5,0x3a5,0x39d);
    }
    init_pair(1,7,0);
    init_pair(2,3,0);
    init_pair(3,0,7);
    init_pair(4,4,0);
    init_pair(5,2,0);
    init_pair(6,0,7);
    init_pair(7,4,0);
    init_pair(8,5,0);
    sVar29 = 9;
    lVar30 = 0;
    do {
      uVar15 = *(uint *)((long)&DAT_00194360 + lVar30);
      init_color((int)(short)(sVar29 + 7),(ulong)((uVar15 >> 0x10 & 0xff) * 1000) / 0xff,
                 (ulong)((uVar15 >> 8 & 0xff) * 1000) / 0xff,(ulong)((uVar15 & 0xff) * 1000) / 0xff)
      ;
      init_pair((int)sVar29,7,(int)(short)(sVar29 + 7));
      lVar30 = lVar30 + 4;
      sVar29 = sVar29 + 1;
    } while (lVar30 != 0x40);
  }
  raw();
  keypad(_stdscr,1);
  noecho();
  wtimeout(_stdscr,0x32);
  curs_set(0);
  set_escdelay(0x19);
  pcVar17 = getcwd(pathbuf,0x1001);
  sVar7 = ctx.bank_directory._M_string_length;
  if (pcVar17 != (char *)0x0) {
    in_R8 = (char *)strlen(pcVar17);
    std::__cxx11::string::_M_replace((ulong)&ctx.bank_directory,0,(char *)sVar7,(ulong)pcVar17);
  }
  pcVar17 = pathbuf + 0x10;
  pathbuf._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)pathbuf,"tui","");
  IniProcessing::beginGroup(&configFile,(string *)pathbuf);
  if ((char *)pathbuf._0_8_ != pcVar17) {
    operator_delete((void *)pathbuf._0_8_);
  }
  IniProcessingVariant::IniProcessingVariant(&local_12b8,&ctx.bank_directory);
  IniProcessing::value((IniProcessingVariant *)pathbuf,&configFile,"bank_directory",&local_12b8);
  IniProcessingVariant::toString_abi_cxx11_(&local_1268,(IniProcessingVariant *)pathbuf);
  std::__cxx11::string::operator=((string *)&ctx.bank_directory,(string *)&local_1268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1268._M_dataplus._M_p != &local_1268.field_2) {
    operator_delete(local_1268._M_dataplus._M_p);
  }
  if ((char *)pathbuf._0_8_ != pcVar17) {
    operator_delete((void *)pathbuf._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12b8.m_data._M_dataplus._M_p != &local_12b8.m_data.field_2) {
    operator_delete(local_12b8.m_data._M_dataplus._M_p);
  }
  IniProcessing::endGroup(&configFile);
  setup_display(&ctx);
  pcVar17 = (char *)gettext("Ready!");
  std::__cxx11::string::string((string *)local_1058,pcVar17,(allocator *)pathbuf);
  std::__cxx11::string::operator=((string *)&ctx.status_text,(string *)local_1058);
  ctx.status_display = false;
  ctx.status_timeout = 10;
  if (local_1058[0] != local_1048) {
    operator_delete(local_1058[0]);
  }
  local_12c0 = std::chrono::_V2::steady_clock::now();
  do {
    if ((ctx.quit != false) || (bVar11 = interface_interrupted(), bVar11)) {
      memset((TUI_windows *)pathbuf,0,0xf8);
      TUI_windows::operator=(&ctx.win,(TUI_windows *)pathbuf);
      TUI_windows::~TUI_windows((TUI_windows *)pathbuf);
      endwin();
      bVar11 = interface_interrupted();
      if (bVar11) {
        curses_interface_exec();
      }
      if ((__uniq_ptr_impl<char,_std::default_delete<char[]>_>)
          ctx.channel_state.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
          .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0) {
        operator_delete__((void *)ctx.channel_state.data._M_t.
                                  super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                  super__Head_base<0UL,_char_*,_false>._M_head_impl);
      }
      ctx.channel_state.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
           (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ctx.bank_directory._M_dataplus._M_p != &ctx.bank_directory.field_2) {
        operator_delete(ctx.bank_directory._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ctx.status_text._M_dataplus._M_p != &ctx.status_text.field_2) {
        operator_delete(ctx.status_text._M_dataplus._M_p);
      }
      TUI_windows::~TUI_windows(&ctx.win);
      return;
    }
    if (local_1290 != (_func_void_void_ptr *)0x0) {
      (*local_1290)(local_1248);
    }
    handle_notifications(&ctx);
    if ((ulong)active_emulator_id == 0xffffffff) {
      _Var18._M_head_impl = (Player *)0x0;
    }
    else {
      _Var18._M_head_impl =
           player[emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl
                  .super__Vector_impl_data._M_start[active_emulator_id].player]._M_t.
           super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
           super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
           super__Head_base<0UL,_Player_*,_false>._M_head_impl;
    }
    if ((Player *)CONCAT44(ctx.player._4_4_,ctx.player._0_4_) != _Var18._M_head_impl) {
      ctx.player._0_4_ = SUB84(_Var18._M_head_impl,0);
      ctx.player._4_4_ = (undefined4)((ulong)_Var18._M_head_impl >> 0x20);
      update_bank_mtime(&ctx);
    }
    lVar30 = std::chrono::_V2::steady_clock::now();
    if ((1000000000 < lVar30 - local_12c0) &&
       (bVar11 = update_bank_mtime(&ctx), local_12c0 = lVar30, bVar11)) {
      if ((ulong)active_emulator_id == 0xffffffff) {
        uVar28 = 0;
      }
      else {
        uVar28 = (ulong)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                        _M_impl.super__Vector_impl_data._M_start[active_emulator_id].player;
      }
      bVar11 = Player::dynamic_load_bank
                         ((Player *)CONCAT44(ctx.player._4_4_,ctx.player._0_4_),
                          player_bank_file_abi_cxx11_[uVar28]._M_dataplus._M_p);
      if (bVar11) {
        pcVar17 = (char *)gettext("Bank has changed on disk. Reload!");
        std::__cxx11::string::string((string *)local_1078,pcVar17,(allocator *)pathbuf);
        std::__cxx11::string::operator=((string *)&ctx.status_text,(string *)local_1078);
        ctx.status_display = false;
        ctx.status_timeout = 10;
        puVar27 = local_1078[0];
        if (local_1078[0] != local_1068) {
LAB_00114a42:
          ctx.status_timeout = 10;
          ctx.status_display = false;
          operator_delete(puVar27);
        }
      }
      else {
        pcVar17 = (char *)gettext("Bank has changed on disk. Reloading failed.");
        std::__cxx11::string::string((string *)local_1098,pcVar17,(allocator *)pathbuf);
        std::__cxx11::string::operator=((string *)&ctx.status_text,(string *)local_1098);
        ctx.status_display = false;
        ctx.status_timeout = 10;
        puVar27 = local_1098[0];
        if (local_1098[0] != local_1088) goto LAB_00114a42;
      }
    }
    WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.outer._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    pPVar5 = (Player *)CONCAT44(ctx.player._4_4_,ctx.player._0_4_);
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.outer._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      get_program_title_abi_cxx11_();
      uVar19 = pathbuf._8_8_;
      wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl,&fde_00200400,0);
      in_R8 = (char *)0x2d;
      in_R9 = (char *)0x2d;
      wborder(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
              super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
              super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x20,0x20);
      wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl,&fde_00200400,0);
      if (_stdscr == 0) {
        uVar28 = 0;
      }
      else {
        uVar28 = (ulong)(((int)*(short *)(_stdscr + 6) - (int)*(short *)(_stdscr + 10)) + 1);
      }
      uVar1 = uVar19 + 2;
      if (uVar1 <= uVar28) {
        wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,&fde_00200400,0);
        uVar28 = uVar28 - uVar1 >> 1;
        iVar12 = wmove(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                       super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                       super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,uVar28 & 0xffffffff);
        if (iVar12 != -1) {
          waddch(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x28);
        }
        iVar12 = (int)uVar28;
        iVar13 = wmove(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                       super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                       super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,
                       iVar12 + (int)uVar19 + 1);
        if (iVar13 != -1) {
          waddch(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x29);
        }
        wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,&fde_00200400,0);
        iVar12 = wmove(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                       super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                       super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,iVar12 + 1);
        if (iVar12 != -1) {
          waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl,pathbuf._0_8_,0xffffffff);
        }
      }
      wnoutrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      if ((char *)pathbuf._0_8_ != pathbuf + 0x10) {
        operator_delete((void *)pathbuf._0_8_);
      }
    }
    WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.playertitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.playertitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar12 = wmove(ctx.win.playertitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                     super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                     super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar12 != -1) {
        uVar19 = gettext("Player");
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar19,0xffffffff);
      }
      if (pPVar5 != (Player *)0x0) {
        wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        PVar14 = (*pPVar5->_vptr_Player[3])(pPVar5);
        in_R8 = Player::name(PVar14);
        PVar14 = (*pPVar5->_vptr_Player[3])(pPVar5);
        in_R9 = Player::version(PVar14);
        mvwprintw(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf);
        wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      }
      wclrtoeol(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.emutitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.emutitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar12 = wmove(ctx.win.emutitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                     super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                     super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar12 != -1) {
        uVar19 = gettext("Emulator");
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar19,0xffffffff);
      }
      if (pPVar5 != (Player *)0x0) {
        wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        iVar12 = wmove(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                       super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                       super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf);
        if (iVar12 != -1) {
          iVar12 = (*pPVar5->_vptr_Player[6])(pPVar5);
          waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl,iVar12,0xffffffff);
        }
        wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      }
      wclrtoeol(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.chipcount._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.chipcount._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar12 = wmove(ctx.win.chipcount._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                     super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                     super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar12 != -1) {
        uVar19 = gettext("Chips");
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar19,0xffffffff);
      }
      if (pPVar5 != (Player *)0x0) {
        wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        uVar15 = (*pPVar5->_vptr_Player[10])(pPVar5);
        in_R8 = (char *)(ulong)uVar15;
        mvwprintw(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf);
        wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl," * ",0xffffffff);
        wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        PVar14 = (*pPVar5->_vptr_Player[3])(pPVar5);
        pcVar17 = Player::chip_name(PVar14);
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,pcVar17,0xffffffff);
        wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      }
      wclrtoeol(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.cpuratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.cpuratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar12 = wmove(ctx.win.cpuratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                     super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                     super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar12 != -1) {
        uVar19 = gettext("CPU");
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar19,0xffffffff);
      }
      print_bar((WINDOW *)
                WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0xf,0xf,0x200,cpuratio,
                (char)in_R8,(char)in_R9,in_stack_ffffffffffffed08);
      wclrtoeol(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.banktitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.banktitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar12 = wmove(ctx.win.banktitle._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                     super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                     super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar12 != -1) {
        uVar19 = gettext("Bank");
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar19,0xffffffff);
      }
      if (pPVar5 != (Player *)0x0) {
        pathbuf._0_8_ = pathbuf + 0x10;
        pathbuf[8] = '\0';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._16_4_ = pathbuf._16_4_ & 0xffffff00;
        if ((ulong)active_emulator_id == 0xffffffff) {
          uVar28 = 0;
        }
        else {
          uVar28 = (ulong)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>
                          ._M_impl.super__Vector_impl_data._M_start[active_emulator_id].player;
        }
        if (player_bank_file_abi_cxx11_[uVar28]._M_string_length == 0) {
          pcVar17 = (char *)gettext("(default)");
          uVar19 = pathbuf._8_8_;
          in_R8 = (char *)strlen(pcVar17);
          std::__cxx11::string::_M_replace((ulong)pathbuf,0,(char *)uVar19,(ulong)pcVar17);
        }
        else {
          psVar31 = player_bank_file_abi_cxx11_ + uVar28;
          lVar30 = std::__cxx11::string::rfind((char)psVar31,0x2f);
          if (lVar30 == -1) {
            local_12b8.m_data._M_dataplus._M_p = (pointer)&local_12b8.m_data.field_2;
            pcVar3 = (psVar31->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_12b8,pcVar3,
                       pcVar3 + player_bank_file_abi_cxx11_[uVar28]._M_string_length);
          }
          else {
            std::__cxx11::string::substr((ulong)&local_12b8,(ulong)psVar31);
          }
          std::__cxx11::string::_M_assign((string *)pathbuf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_12b8.m_data._M_dataplus._M_p != &local_12b8.m_data.field_2) {
            operator_delete(local_12b8.m_data._M_dataplus._M_p);
          }
        }
        wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        iVar12 = wmove(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                       super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                       super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf);
        if (iVar12 != -1) {
          waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl,pathbuf._0_8_,0xffffffff);
        }
        wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        if ((char *)pathbuf._0_8_ != pathbuf + 0x10) {
          operator_delete((void *)pathbuf._0_8_);
        }
      }
      wclrtoeol(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.chanalloc._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.chanalloc._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar12 = wmove(ctx.win.chanalloc._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                     super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                     super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar12 != -1) {
        uVar19 = gettext("Alloc mode");
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar19,0xffffffff);
      }
      if (pPVar5 != (Player *)0x0) {
        wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
        iVar12 = wmove(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                       super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                       super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf);
        if (iVar12 != -1) {
          pcVar17 = Player::get_channel_alloc_mode_name(pPVar5);
          waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl,pcVar17,0xffffffff);
        }
        wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      }
      wclrtoeol(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    pathbuf._0_8_ = lvcurrent[0];
    local_12b8.m_data._M_dataplus._M_p = (pointer)lvcurrent[1];
    local_1268._M_dataplus._M_p = (pointer)gettext("Left");
    bankname_field._M_dataplus._M_p = (pointer)gettext("Right");
    WVar6 = ctx.win.volumeratio;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.volumeratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      iVar12 = wmove(ctx.win.volumeratio._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                     super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                     super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      if (iVar12 != -1) {
        uVar19 = gettext("Volume");
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,uVar19,0xffffffff);
      }
      wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      in_R8 = (char *)(ulong)(uint)player_volume;
      mvwprintw(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0xf);
      wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x200,0);
      wclrtoeol(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    psVar31 = &local_1268;
    pIVar20 = (IniProcessingVariant *)pathbuf;
    lVar30 = 0;
    bVar11 = true;
    do {
      bVar25 = bVar11;
      w_00 = ctx.win.volume[lVar30]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
             super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
             super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
      if (w_00 != (WINDOW *)0x0) {
        local_1240 = (pIVar20->m_data)._M_dataplus._M_p;
        iVar12 = wmove(w_00,0,0);
        if (iVar12 != -1) {
          waddnstr(w_00,(psVar31->_M_dataplus)._M_p,0xffffffff);
        }
        print_bar(w_00,7,((int)w_00->_maxx - (int)w_00->_begx) + -6,0x200500,(double)local_1240,
                  (char)in_R8,(char)in_R9,in_stack_ffffffffffffed08);
        wclrtoeol(w_00);
        wnoutrefresh(w_00);
      }
      lVar30 = 1;
      psVar31 = &bankname_field;
      pIVar20 = &local_12b8;
      bVar11 = false;
    } while (bVar25);
    lVar30 = 0;
    do {
      p_Var4 = ctx.win.instrument[lVar30]._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
      if (p_Var4 != (_win_st *)0x0) {
        in_R8 = (char *)(lVar30 + 1U & 0xffffffff);
        mvwprintw(p_Var4,0,0,"%2u: [");
        wattr_on(p_Var4,0x200800,0);
        pPVar26 = channel_map + lVar30;
        wprintw(p_Var4,"%3u",pPVar26->gm);
        wattr_off(p_Var4,0x200800,0);
        waddnstr(p_Var4,"]",0xffffffff);
        uVar15 = midi_channel_note_count[lVar30];
        wattr_on(p_Var4,0x200500,0);
        iVar12 = wmove(p_Var4,0,0xb);
        if (iVar12 != -1) {
          uVar19 = 0x2a;
          if (uVar15 == 0) {
            uVar19 = 0x20;
          }
          waddch(p_Var4,uVar19);
        }
        wattr_off(p_Var4,0x200500,0);
        if (lVar30 == 9) {
          ctx.perc_display_cycle = ctx.perc_display_cycle + 1;
          if ((ctx.perc_display_cycle == 10) &&
             (ctx.perc_display_cycle = 0, midi_channel_last_note_p1[9] != 0)) {
            uVar15 = midi_channel_last_note_p1[9] - 1;
            ctx.have_perc_display_program = true;
            ctx.perc_display_program.spec = midi_db.midi_perc_[uVar15].spec;
            ctx.perc_display_program._4_4_ = *(undefined4 *)&midi_db.midi_perc_[uVar15].field_0x4;
            ctx.perc_display_program.name = midi_db.midi_perc_[uVar15].name;
          }
          pcVar17 = ctx.perc_display_program.name;
          spec = ctx.perc_display_program.spec;
          if (ctx.have_perc_display_program == false) {
            pcVar17 = (char *)gettext("Percussion");
            spec = GM;
          }
        }
        else {
          spec = GM;
          if ((channel_map[lVar30].bank_lsb != 0 || channel_map[lVar30].bank_msb != 0) &&
             (pMVar21 = Midi_Db::find_ex(&midi_db,channel_map[lVar30].bank_msb,
                                         channel_map[lVar30].bank_lsb,pPVar26->gm),
             pMVar21 != (Midi_Program_Ex *)0x0)) {
            spec = pMVar21->spec;
            pcVar17 = pMVar21->name;
            if (pMVar21->name != (char *)0x0) goto LAB_001153e6;
          }
          pcVar17 = midi_db.midi_inst_[pPVar26->gm];
        }
LAB_001153e6:
        uVar2 = (&DAT_001943a0)[spec];
        wattr_on(p_Var4,uVar2,0);
        iVar12 = wmove(p_Var4,0,0xc);
        if (iVar12 != -1) {
          waddnstr(p_Var4,pcVar17,0xffffffff);
        }
        wattr_off(p_Var4,uVar2,0);
        if (spec != GM) {
          pcVar17 = midi_spec_name(spec);
          wprintw(p_Var4," [%s]",pcVar17);
        }
        wclrtoeol(p_Var4);
        wrefresh(p_Var4);
      }
      WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
      super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
      _M_head_impl = ctx.win.status._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                     super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                     super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 0x10);
    if (((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
         ctx.win.status._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
         super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
         _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) &&
       (ctx.status_text._M_string_length != 0)) {
      if (ctx.status_display == false) {
        wattr_on(ctx.win.status._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x300,0);
        iVar12 = wmove(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                       super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                       super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
        if (iVar12 != -1) {
          waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
                   ctx.status_text._M_dataplus._M_p,0xffffffff);
        }
        wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x300,0);
        uVar19 = std::chrono::_V2::steady_clock::now();
        ctx.status_start.__d.__r._0_4_ = (undefined4)uVar19;
        ctx.status_start.__d.__r._4_4_ = (undefined4)((ulong)uVar19 >> 0x20);
        ctx.status_display = true;
        wclrtoeol(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      }
      else {
        lVar30 = std::chrono::_V2::steady_clock::now();
        if (lVar30 - CONCAT44(ctx.status_start.__d.__r._4_4_,(undefined4)ctx.status_start.__d.__r)
            <= (long)((ulong)ctx.status_timeout * 1000000000)) goto LAB_0011554d;
        ctx.status_text._M_string_length = 0;
        *ctx.status_text._M_dataplus._M_p = '\0';
        ctx.status_display = false;
        werase(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      }
      wnoutrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
LAB_0011554d:
    WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.keydesc1._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.keydesc1._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      if (update_display(TUI_context&)::keydesc == '\0') {
        curses_interface_exec();
      }
      uVar28 = 0;
      do {
        wmove(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
              super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
              super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,uVar28 & 0xffffffff);
        wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
                 *(undefined8 *)((long)&update_display(TUI_context&)::keydesc + uVar28),0xffffffff);
        wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl," ",0xffffffff);
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
                 *(undefined8 *)((long)&DAT_0021c308 + uVar28),0xffffffff);
        uVar28 = uVar28 + 0x10;
      } while (uVar28 != 0x50);
      wclrtoeol(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.keydesc2._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.keydesc2._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      if (update_display(TUI_context&)::keydesc == '\0') {
        curses_interface_exec();
      }
      uVar28 = 0;
      do {
        wmove(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
              super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
              super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,uVar28 & 0xffffffff);
        wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
                 *(undefined8 *)((long)&update_display(TUI_context&)::keydesc + uVar28),0xffffffff);
        wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                  super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                  super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl," ",0xffffffff);
        waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
                 *(undefined8 *)((long)&DAT_0021c368 + uVar28),0xffffffff);
        uVar28 = uVar28 + 0x10;
      } while (uVar28 != 0x50);
      wclrtoeol(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
    _M_head_impl = ctx.win.keydesc3._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
        ctx.win.keydesc3._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
        super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
        _M_head_impl != (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0) {
      if (update_display(TUI_context&)::keydesc == '\0') {
        curses_interface_exec();
      }
      wmove(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
            super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
            super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0,0);
      wattr_on(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
      waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl,
               update_display(TUI_context&)::keydesc,0xffffffff);
      wattr_off(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl,0x600,0);
      waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl," ",0xffffffff);
      waddnstr(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
               super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
               super__Head_base<0UL,__win_st_*,_false>._M_head_impl,DAT_0021c3c8,0xffffffff);
      wclrtoeol(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      wnoutrefresh(WVar6._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                   super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                   super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
    }
    iVar12 = wgetch(_stdscr);
    bVar11 = handle_anylevel_key(&ctx,iVar12);
    if ((bVar11) ||
       (pPVar5 = (Player *)CONCAT44(ctx.player._4_4_,ctx.player._0_4_), pPVar5 == (Player *)0x0))
    goto switchD_0011578d_caseD_3d;
    if (0x4f < iVar12) {
      switch(iVar12) {
      case 0x5b:
        uVar15 = (*pPVar5->_vptr_Player[10])(pPVar5);
        if (1 < uVar15) {
          Player::dynamic_set_chip_count(pPVar5,uVar15 - 1);
          builtin_strncpy(pathbuf + 0x10,"synth",6);
          pathbuf[8] = '\x05';
          pathbuf[9] = '\0';
          pathbuf[10] = '\0';
          pathbuf[0xb] = '\0';
          pathbuf[0xc] = '\0';
          pathbuf[0xd] = '\0';
          pathbuf[0xe] = '\0';
          pathbuf[0xf] = '\0';
          pathbuf._0_8_ = pathbuf + 0x10;
          IniProcessing::beginGroup(&configFile,(string *)pathbuf);
          if ((char *)pathbuf._0_8_ != pathbuf + 0x10) goto LAB_00115f86;
          goto LAB_00115f8b;
        }
        break;
      case 0x5c:
      case 0x5e:
      case 0x5f:
      case 0x60:
        break;
      case 0x5d:
        iVar12 = (*pPVar5->_vptr_Player[10])(pPVar5);
        Player::dynamic_set_chip_count(pPVar5,iVar12 + 1);
        builtin_strncpy(pathbuf + 0x10,"synth",6);
        pathbuf[8] = '\x05';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._0_8_ = pathbuf + 0x10;
        IniProcessing::beginGroup(&configFile,(string *)pathbuf);
        if ((char *)pathbuf._0_8_ != pathbuf + 0x10) {
LAB_00115f86:
          operator_delete((void *)pathbuf._0_8_);
        }
LAB_00115f8b:
        PVar14 = (*pPVar5->_vptr_Player[10])(pPVar5);
        pcVar17 = "nchip";
LAB_00116039:
        IniProcessing::setValue(&configFile,pcVar17,PVar14);
        goto LAB_00116047;
      case 0x61:
        goto switchD_0011578d_caseD_41;
      case 0x62:
        goto switchD_0011578d_caseD_42;
      case 99:
        goto switchD_0011578d_caseD_43;
      default:
        if ((iVar12 == 0x50) || (iVar12 == 0x70)) {
          Player::dynamic_panic(pPVar5);
        }
      }
      goto switchD_0011578d_caseD_3d;
    }
    switch(iVar12) {
    case 0x3c:
      if (active_emulator_id != 0) {
        dynamic_switch_emulator_id(active_emulator_id - 1);
        builtin_strncpy(pathbuf + 0x10,"synth",6);
        pathbuf[8] = '\x05';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._0_8_ = pathbuf + 0x10;
        IniProcessing::beginGroup(&configFile,(string *)pathbuf);
        if ((char *)pathbuf._0_8_ != pathbuf + 0x10) {
          operator_delete((void *)pathbuf._0_8_);
        }
        IniProcessing::setValue(&configFile,"emulator",pPVar5->emulator_);
LAB_00115ef5:
        if (active_emulator_id == 0xffffffff) {
          PVar14 = OPL3;
        }
        else {
          PVar14 = emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                   _M_impl.super__Vector_impl_data._M_start[active_emulator_id].player;
        }
        pcVar17 = "pt";
        goto LAB_00116039;
      }
      break;
    case 0x3d:
    case 0x3f:
    case 0x40:
      break;
    case 0x3e:
      uVar15 = active_emulator_id + 1;
      uVar28 = ((long)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      if (uVar15 <= uVar28 && uVar28 - uVar15 != 0) {
        dynamic_switch_emulator_id(uVar15);
        builtin_strncpy(pathbuf + 0x10,"synth",6);
        pathbuf[8] = '\x05';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._0_8_ = pathbuf + 0x10;
        IniProcessing::beginGroup(&configFile,(string *)pathbuf);
        if ((char *)pathbuf._0_8_ != pathbuf + 0x10) {
          operator_delete((void *)pathbuf._0_8_);
        }
        IniProcessing::setValue(&configFile,"emulator",pPVar5->emulator_);
        goto LAB_00115ef5;
      }
      break;
    case 0x41:
switchD_0011578d_caseD_41:
      iVar13 = (*pPVar5->_vptr_Player[0xf])(pPVar5);
      iVar12 = iVar13 + 1;
      if (1 < iVar13) {
        iVar12 = -1;
      }
      Player::dynamic_set_channel_alloc(pPVar5,iVar12);
      builtin_strncpy(pathbuf + 0x10,"synth",6);
      pathbuf[8] = '\x05';
      pathbuf[9] = '\0';
      pathbuf[10] = '\0';
      pathbuf[0xb] = '\0';
      pathbuf[0xc] = '\0';
      pathbuf[0xd] = '\0';
      pathbuf[0xe] = '\0';
      pathbuf[0xf] = '\0';
      pathbuf._0_8_ = pathbuf + 0x10;
      IniProcessing::beginGroup(&configFile,(string *)pathbuf);
      if ((char *)pathbuf._0_8_ != pathbuf + 0x10) {
        operator_delete((void *)pathbuf._0_8_);
      }
      pcVar17 = "chanalloc";
      goto LAB_0011601f;
    case 0x42:
switchD_0011578d_caseD_42:
      erase();
      pathbuf._0_8_ = pathbuf + 0x10;
      pathbuf[8] = '\0';
      pathbuf[9] = '\0';
      pathbuf[10] = '\0';
      pathbuf[0xb] = '\0';
      pathbuf[0xc] = '\0';
      pathbuf[0xd] = '\0';
      pathbuf[0xe] = '\0';
      pathbuf[0xf] = '\0';
      pathbuf._16_4_ = pathbuf._16_4_ & 0xffffff00;
      pathbuf._32_8_ = pathbuf + 0x30;
      pathbuf[0x28] = '\0';
      pathbuf[0x29] = '\0';
      pathbuf[0x2a] = '\0';
      pathbuf[0x2b] = '\0';
      pathbuf[0x2c] = '\0';
      pathbuf[0x2d] = '\0';
      pathbuf[0x2e] = '\0';
      pathbuf[0x2f] = '\0';
      pathbuf[0x30] = '\0';
      pathbuf._64_8_ = pathbuf + 0x50;
      pathbuf[0x48] = '\0';
      pathbuf[0x49] = '\0';
      pathbuf[0x4a] = '\0';
      pathbuf[0x4b] = '\0';
      pathbuf[0x4c] = '\0';
      pathbuf[0x4d] = '\0';
      pathbuf[0x4e] = '\0';
      pathbuf[0x4f] = '\0';
      pathbuf[0x50] = '\0';
      pathbuf[0x60] = '\0';
      pcVar17 = (char *)gettext("Load bank");
      uVar19 = pathbuf._72_8_;
      strlen(pcVar17);
      std::__cxx11::string::_M_replace((ulong)(pathbuf + 0x40),0,(char *)uVar19,(ulong)pcVar17);
      std::__cxx11::string::_M_assign((string *)pathbuf);
      File_Selector::File_Selector(&fs,(File_Selection_Options *)pathbuf);
      w._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
      super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
      _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                     derwin(_stdscr,_LINES,_COLS,0,0);
      File_Selector::setup_display
                (&fs,(WINDOW *)
                     w._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                     super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                     super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      File_Selector::update(&fs);
      pvVar9 = ctx.idle_data;
      p_Var8 = ctx.idle_proc;
      iVar12 = wgetch(_stdscr);
      FVar16 = Continue;
      while ((ctx.quit == false && (bVar11 = interface_interrupted(), FVar16 == Continue && !bVar11)
             )) {
        if (p_Var8 != (_func_void_void_ptr *)0x0) {
          (*p_Var8)(pvVar9);
        }
        handle_notifications(&ctx);
        bVar11 = handle_anylevel_key(&ctx,iVar12);
        if (bVar11) {
          FVar16 = Continue;
          if (iVar12 == 0x19a) {
            _Var22.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
            super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
            super__Head_base<0UL,__win_st_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)derwin(_stdscr,_LINES,_COLS,0,0);
            bVar11 = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
                     w._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                     super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                     super__Head_base<0UL,__win_st_*,_false>._M_head_impl !=
                     (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
            w._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
            super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
            super__Head_base<0UL,__win_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 _Var22.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
            if (bVar11) {
              delwin();
            }
            File_Selector::setup_display
                      (&fs,(WINDOW *)
                           w._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                           super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                           super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
          }
        }
        else {
          FVar16 = File_Selector::key(&fs,iVar12);
          File_Selector::update(&fs);
        }
        doupdate();
        iVar12 = wgetch(_stdscr);
      }
      if (FVar16 == Ok) {
        bVar11 = Player::dynamic_load_bank(pPVar5,(char *)pathbuf._32_8_);
        if (bVar11) {
          pcVar17 = (char *)gettext("Bank loaded!");
          std::__cxx11::string::string((string *)&local_12b8,pcVar17,(allocator *)&bankname_field);
          std::__cxx11::string::operator=((string *)&ctx.status_text,(string *)&local_12b8);
          ctx.status_display = false;
          ctx.status_timeout = 10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_12b8.m_data._M_dataplus._M_p != &local_12b8.m_data.field_2) {
            operator_delete(local_12b8.m_data._M_dataplus._M_p);
          }
          if ((ulong)active_emulator_id == 0xffffffff) {
            uVar28 = 0;
          }
          else {
            uVar28 = (ulong)emulator_ids.
                            super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
                            super__Vector_impl_data._M_start[active_emulator_id].player;
          }
          std::__cxx11::string::_M_assign((string *)(player_bank_file_abi_cxx11_ + uVar28));
          update_bank_mtime(&ctx);
        }
        else {
          pcVar17 = (char *)gettext("Error loading the bank file.");
          std::__cxx11::string::string((string *)&local_1268,pcVar17,(allocator *)&bankname_field);
          std::__cxx11::string::operator=((string *)&ctx.status_text,(string *)&local_1268);
          ctx.status_display = false;
          ctx.status_timeout = 10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1268._M_dataplus._M_p != &local_1268.field_2) {
            operator_delete(local_1268._M_dataplus._M_p);
          }
        }
        std::__cxx11::string::_M_assign((string *)&ctx.bank_directory);
      }
      bankname_field._M_string_length = 3;
      bankname_field.field_2._M_allocated_capacity._0_4_ = 0x697574;
      bankname_field._M_dataplus._M_p = (pointer)&bankname_field.field_2;
      IniProcessing::beginGroup(&configFile,&bankname_field);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)bankname_field._M_dataplus._M_p != &bankname_field.field_2) {
        operator_delete(bankname_field._M_dataplus._M_p);
      }
      IniProcessing::setValue(&configFile,"bank_directory",&ctx.bank_directory);
      lVar30 = 0;
      bVar11 = true;
      do {
        bVar25 = bVar11;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str,'\x01');
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p,(uint)__str._M_string_length,(uint)lVar30);
        in_R8 = (char *)0x9;
        plVar23 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x19455c);
        bankname_field._M_dataplus._M_p = (pointer)&bankname_field.field_2;
        psVar24 = (size_type *)(plVar23 + 2);
        if ((size_type *)*plVar23 == psVar24) {
          bankname_field.field_2._M_allocated_capacity = *psVar24;
          bankname_field.field_2._8_8_ = plVar23[3];
        }
        else {
          bankname_field.field_2._M_allocated_capacity = *psVar24;
          bankname_field._M_dataplus._M_p = (pointer)*plVar23;
        }
        bankname_field._M_string_length = plVar23[1];
        *plVar23 = (long)psVar24;
        plVar23[1] = 0;
        *(undefined1 *)(plVar23 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p);
        }
        IniProcessing::setValue
                  (&configFile,bankname_field._M_dataplus._M_p,player_bank_file_abi_cxx11_ + lVar30)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)bankname_field._M_dataplus._M_p != &bankname_field.field_2) {
          operator_delete(bankname_field._M_dataplus._M_p);
        }
        lVar30 = 1;
        bVar11 = false;
      } while (bVar25);
      IniProcessing::endGroup(&configFile);
      IniProcessing::writeIniFile(&configFile);
      erase();
      std::unique_ptr<_win_st,_WINDOW_deleter>::~unique_ptr(&w);
      File_Selector::~File_Selector(&fs);
      if ((char *)pathbuf._64_8_ != pathbuf + 0x50) {
        operator_delete((void *)pathbuf._64_8_);
      }
      if ((char *)pathbuf._32_8_ != pathbuf + 0x30) {
        operator_delete((void *)pathbuf._32_8_);
      }
      if ((char *)pathbuf._0_8_ != pathbuf + 0x10) {
        operator_delete((void *)pathbuf._0_8_);
      }
      break;
    case 0x43:
switchD_0011578d_caseD_43:
      erase();
      in_R8 = (char *)0x0;
      pathbuf._0_8_ = derwin(_stdscr,_LINES,_COLS,0);
      Channel_Monitor::Channel_Monitor((Channel_Monitor *)&bankname_field);
      Channel_Monitor::setup_display((Channel_Monitor *)&bankname_field,(WINDOW *)pathbuf._0_8_);
      Channel_Monitor::setup_player((Channel_Monitor *)&bankname_field,pPVar5);
      Channel_Monitor::update
                ((Channel_Monitor *)&bankname_field,
                 (char *)ctx.channel_state.data._M_t.
                         super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                         super__Head_base<0UL,_char_*,_false>._M_head_impl,ctx.channel_state.size,
                 ctx.channel_state.serial);
      pvVar9 = ctx.idle_data;
      p_Var8 = ctx.idle_proc;
      iVar12 = wgetch(_stdscr);
      iVar13 = 1;
      while ((ctx.quit == false && (bVar11 = interface_interrupted(), !bVar11 && 0 < iVar13))) {
        if (p_Var8 != (_func_void_void_ptr *)0x0) {
          (*p_Var8)(pvVar9);
        }
        handle_notifications(&ctx);
        bVar11 = handle_anylevel_key(&ctx,iVar12);
        if (bVar11) {
          if (iVar12 == 0x19a) {
            in_R8 = (char *)0x0;
            uVar19 = derwin(_stdscr,_LINES,_COLS,0);
            bVar11 = pathbuf._0_8_ != 0;
            pathbuf._0_8_ = uVar19;
            if (bVar11) {
              delwin();
            }
            Channel_Monitor::setup_display
                      ((Channel_Monitor *)&bankname_field,(WINDOW *)pathbuf._0_8_);
          }
        }
        else {
          iVar13 = Channel_Monitor::key((Channel_Monitor *)&bankname_field,iVar12);
          Channel_Monitor::update
                    ((Channel_Monitor *)&bankname_field,
                     (char *)ctx.channel_state.data._M_t.
                             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl,
                     ctx.channel_state.size,ctx.channel_state.serial);
        }
        doupdate();
        iVar12 = wgetch(_stdscr);
      }
      erase();
      Channel_Monitor::~Channel_Monitor((Channel_Monitor *)&bankname_field);
      std::unique_ptr<_win_st,_WINDOW_deleter>::~unique_ptr
                ((unique_ptr<_win_st,_WINDOW_deleter> *)pathbuf);
      break;
    default:
      if (iVar12 == 0x2a) {
        if (0x1f2 < player_volume) {
          player_volume = 499;
        }
        player_volume = player_volume + 1;
        builtin_strncpy(pathbuf + 0x10,"synth",6);
        pathbuf[8] = '\x05';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._0_8_ = pathbuf + 0x10;
        IniProcessing::beginGroup(&configFile,(string *)pathbuf);
        if ((char *)pathbuf._0_8_ != pathbuf + 0x10) {
LAB_00116009:
          operator_delete((void *)pathbuf._0_8_);
        }
      }
      else {
        if (iVar12 != 0x2f) break;
        if (player_volume < 2) {
          player_volume = 1;
        }
        player_volume = player_volume + -1;
        builtin_strncpy(pathbuf + 0x10,"synth",6);
        pathbuf[8] = '\x05';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._0_8_ = pathbuf + 0x10;
        IniProcessing::beginGroup(&configFile,(string *)pathbuf);
        if ((char *)pathbuf._0_8_ != pathbuf + 0x10) goto LAB_00116009;
      }
      pcVar17 = "volume";
      iVar12 = player_volume;
LAB_0011601f:
      IniProcessing::setValue(&configFile,pcVar17,iVar12);
LAB_00116047:
      IniProcessing::endGroup(&configFile);
      IniProcessing::writeIniFile(&configFile);
    }
switchD_0011578d_caseD_3d:
    doupdate();
  } while( true );
}

Assistant:

void curses_interface_exec(void (*idle_proc)(void *), void *idle_data)
{
    Screen screen;
    screen.init();

    TUI_context ctx;
    ctx.idle_proc = idle_proc;
    ctx.idle_data = idle_data;
#if defined(PDCURSES)
    install_event_hook(ctx);
#endif

    if (has_colors())
        setup_colors();
    raw();
    keypad(stdscr, true);
    noecho();
#ifdef ADLJACK_GTK3
    const unsigned timeout_ms = 1;
#else
    const unsigned timeout_ms = 50;
#endif
    timeout(timeout_ms);
    curs_set(0);
#if !defined(PDCURSES)
    set_escdelay(25);
#endif

#if defined(PDCURSES)
    PDC_set_title(get_program_title().c_str());
#endif

    {
        char pathbuf[PATH_MAX + 1];
        if (char *path = getcwd(pathbuf, sizeof(pathbuf)))
            ctx.bank_directory.assign(path);
    }

    configFile.beginGroup("tui");
    ctx.bank_directory = configFile.value("bank_directory", ctx.bank_directory).toString();
    configFile.endGroup();

#ifdef ADLJACK_GTK3
    s_tray_icon = create_tray_icon();

    if (active_player().type() == Player_Type::OPL3) {
        gtk_status_icon_set_from_icon_name(s_tray_icon, "adljack");
    } else {
        gtk_status_icon_set_from_icon_name(s_tray_icon, "opnjack");
    }

    g_signal_connect(G_OBJECT(s_tray_icon), "popup-menu", G_CALLBACK(tray_icon_on_menu),  &ctx);
#endif

    setup_display(ctx);
    show_status(ctx, _("Ready!"));

    unsigned bank_check_interval = 1;
    stc::steady_clock::time_point bank_check_last = stc::steady_clock::now();

    while (!ctx.quit && !interface_interrupted()) {
        if (idle_proc)
            idle_proc(idle_data);

        handle_notifications(ctx);

        Player *player = have_active_player() ? &active_player() : nullptr;
        if (ctx.player != player) {
            ctx.player = player;
            update_bank_mtime(ctx);
        }

        stc::steady_clock::time_point now = stc::steady_clock::now();
        if (now - bank_check_last > stc::seconds(bank_check_interval)) {
            if (update_bank_mtime(ctx)) {
                if (ctx.player->dynamic_load_bank(active_bank_file().c_str()))
                    show_status(ctx, _("Bank has changed on disk. Reload!"));
                else
                    show_status(ctx, _("Bank has changed on disk. Reloading failed."));
            }
            bank_check_last = now;
        }

        update_display(ctx);

#ifdef ADLJACK_GTK3
        gtk_main_iteration_do(false);
#endif
        int key = getch();
        if (!handle_anylevel_key(ctx, key))
            handle_toplevel_key(ctx, key);
        doupdate();
    }
    ctx.win = TUI_windows();
    screen.end();

#ifdef ADLJACK_GTK3
    gtk_status_icon_set_visible(s_tray_icon, FALSE);
#endif

    if (interface_interrupted())
        fprintf(stderr, "Interrupted.\n");
}